

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateTopHeaderGuard
          (FileGenerator *this,Printer *printer,bool pb_h)

{
  bool bVar1;
  Options *in_R8;
  string local_78;
  undefined1 local_58 [8];
  Formatter format;
  bool pb_h_local;
  Printer *printer_local;
  FileGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = pb_h;
  Formatter::Formatter((Formatter *)local_58,printer,&this->variables_);
  IncludeGuard_abi_cxx11_
            (&local_78,(cpp *)this->file_,
             (FileDescriptor *)
             (ulong)(format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1),
             (bool)((char)this + '8'),in_R8);
  Formatter::operator()
            ((Formatter *)local_58,
             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n#ifndef $1$\n#define $1$\n\n#include <limits>\n#include <string>\n"
             ,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if (((this->options_).opensource_runtime & 1U) == 0) {
    bVar1 = std::
            vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
            ::empty(&this->enum_generators_);
    if (!bVar1) {
      Formatter::operator()<>((Formatter *)local_58,"#include <type_traits>\n");
    }
  }
  Formatter::operator()<>((Formatter *)local_58,"\n");
  Formatter::~Formatter((Formatter *)local_58);
  return;
}

Assistant:

void FileGenerator::GenerateTopHeaderGuard(io::Printer* printer, bool pb_h) {
  Formatter format(printer, variables_);
  // Generate top of header.
  format(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// source: $filename$\n"
      "\n"
      "#ifndef $1$\n"
      "#define $1$\n"
      "\n"
      "#include <limits>\n"
      "#include <string>\n",
      IncludeGuard(file_, pb_h, options_));
  if (!options_.opensource_runtime && !enum_generators_.empty()) {
    // Add header to provide std::is_integral for safe Enum_Name() function.
    format("#include <type_traits>\n");
  }
  format("\n");
}